

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O0

void __thiscall
google::
HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::HashtableInterface_DenseHashSet
          (HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,size_type expected_max_items,hasher *hf,key_equal *eql,allocator_type *alloc)

{
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  key_type *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc8;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffffd0;
  
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::BaseHashtableInterface
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(hasher *)in_RDI,
             (key_equal *)in_stack_ffffffffffffffb8,(allocator_type *)0xa91910);
  in_RDI->_vptr_BaseHashtableInterface =
       (_func_int **)&PTR__HashtableInterface_DenseHashSet_01301e58;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_empty_key(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

explicit HashtableInterface_DenseHashSet(
      typename p::size_type expected_max_items = 0,
      const typename p::hasher& hf = typename p::hasher(),
      const typename p::key_equal& eql = typename p::key_equal(),
      const typename p::allocator_type& alloc = typename p::allocator_type())
      : BaseHashtableInterface<ht>(expected_max_items, hf, eql, alloc) {
    this->set_empty_key(EMPTY_KEY);
  }